

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

void duckdb_re2::Regexp::RemoveLeadingString(Regexp *re,int n)

{
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  void *pvVar4;
  Regexp *this;
  Regexp *that;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ulong uVar6;
  Regexp *stk [4];
  long local_1d8 [5];
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar6 = 0;
  while( true ) {
    uVar1 = re->op_;
    if (uVar1 != '\x05') break;
    if (uVar6 < 4) {
      local_1d8[uVar6] = (long)re;
      uVar6 = uVar6 + 1;
    }
    if (re->nsub_ < 2) {
      paVar5 = &re->field_5;
    }
    else {
      paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    re = paVar5->subone_;
  }
  if (uVar1 != '\x03') {
    if (uVar1 != '\x04') goto LAB_01ce5691;
    iVar3 = (re->arguments).repeat.max_;
    if (n < iVar3) {
      if (iVar3 + -1 == n) {
        pvVar4 = (re->arguments).the_union_[1];
        iVar3 = *(int *)((long)pvVar4 + (long)iVar3 * 4 + -4);
        if (pvVar4 != (void *)0x0) {
          operator_delete__(pvVar4);
        }
        (re->arguments).capture.name_ = (string *)0x0;
        (re->arguments).repeat.max_ = iVar3;
        re->op_ = '\x03';
      }
      else {
        (re->arguments).repeat.max_ = iVar3 - n;
        memmove((re->arguments).the_union_[1],
                (void *)((long)(re->arguments).the_union_[1] + (long)n * 4),(long)(iVar3 - n) << 2);
      }
      goto LAB_01ce5691;
    }
    if ((re->arguments).the_union_[1] != (void *)0x0) {
      operator_delete__((re->arguments).the_union_[1]);
    }
    (re->arguments).capture.name_ = (string *)0x0;
  }
  (re->arguments).repeat.max_ = 0;
  re->op_ = '\x02';
LAB_01ce5691:
  if (uVar6 != 0) {
    do {
      uVar6 = uVar6 - 1;
      this = (Regexp *)local_1d8[uVar6];
      if (this->nsub_ < 2) {
        paVar5 = &this->field_5;
      }
      else {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      if (paVar5->subone_->op_ == '\x02') {
        Decref(paVar5->subone_);
        paVar5->submany_ = (Regexp **)0x0;
        uVar2 = this->nsub_;
        if (uVar2 < 2) {
          local_1b0 = 0;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Concat of ",10);
          std::ostream::operator<<(local_1a8,(uint)this->nsub_);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          (this->field_5).submany_ = (Regexp **)0x0;
          this->op_ = '\x02';
        }
        else if (uVar2 == 2) {
          that = paVar5[1].subone_;
          paVar5[1].submany_ = (Regexp **)0x0;
          Swap(this,that);
          Decref(that);
        }
        else {
          this->nsub_ = uVar2 - 1;
          memmove(paVar5,paVar5 + 1,(ulong)(ushort)(uVar2 - 1) << 3);
        }
      }
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void Regexp::RemoveLeadingString(Regexp* re, int n) {
  // Chase down concats to find first string.
  // For regexps generated by parser, nested concats are
  // flattened except when doing so would overflow the 16-bit
  // limit on the size of a concatenation, so we should never
  // see more than two here.
  Regexp* stk[4];
  size_t d = 0;
  while (re->op() == kRegexpConcat) {
    if (d < arraysize(stk))
      stk[d++] = re;
    re = re->sub()[0];
  }

  // Remove leading string from re.
  if (re->op() == kRegexpLiteral) {
    re->arguments.rune_ = 0;
    re->op_ = kRegexpEmptyMatch;
  } else if (re->op() == kRegexpLiteralString) {
    if (n >= re->arguments.literal_string.nrunes_) {
      delete[] re->arguments.literal_string.runes_;
      re->arguments.literal_string.runes_ = NULL;
      re->arguments.literal_string.nrunes_ = 0;
      re->op_ = kRegexpEmptyMatch;
    } else if (n == re->arguments.literal_string.nrunes_ - 1) {
      Rune rune = re->arguments.literal_string.runes_[re->arguments.literal_string.nrunes_ - 1];
      delete[] re->arguments.literal_string.runes_;
      re->arguments.literal_string.runes_ = NULL;
      re->arguments.literal_string.nrunes_ = 0;
      re->arguments.rune_ = rune;
      re->op_ = kRegexpLiteral;
    } else {
      re->arguments.literal_string.nrunes_ -= n;
      memmove(re->arguments.literal_string.runes_, re->arguments.literal_string.runes_ + n, re->arguments.literal_string.nrunes_ * sizeof re->arguments.literal_string.runes_[0]);
    }
  }

  // If re is now empty, concatenations might simplify too.
  while (d > 0) {
    re = stk[--d];
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch) {
      sub[0]->Decref();
      sub[0] = NULL;
      // Delete first element of concat.
      switch (re->nsub()) {
        case 0:
        case 1:
          // Impossible.
          LOG(DFATAL) << "Concat of " << re->nsub();
          re->submany_ = NULL;
          re->op_ = kRegexpEmptyMatch;
          break;

        case 2: {
          // Replace re with sub[1].
          Regexp* old = sub[1];
          sub[1] = NULL;
          re->Swap(old);
          old->Decref();
          break;
        }

        default:
          // Slide down.
          re->nsub_--;
          memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
          break;
      }
    }
  }
}